

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::receiveIncomingMessage
          (ConnectionImpl *this)

{
  PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> **this_00;
  bool bVar1;
  PromiseFulfiller<void> *pPVar2;
  Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_> *__x;
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *pPVar3;
  reference t;
  Own<capnp::IncomingRpcMessage> *pOVar4;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *pPVar5;
  long in_RSI;
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> PVar6;
  Maybe<kj::Own<capnp::IncomingRpcMessage>_> local_1e8;
  undefined1 local_1d8 [8];
  Own<capnp::IncomingRpcMessage> result;
  PromiseFulfillerPair<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> paf;
  undefined1 local_191;
  Own<kj::PromiseFulfiller<void>_> *local_190;
  Own<kj::PromiseFulfiller<void>_> *f;
  Exception local_178;
  Exception *local_20;
  Exception *e;
  ConnectionImpl *this_local;
  
  this_local = this;
  local_20 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(in_RSI + 0x38));
  if (local_20 == (Exception *)0x0) {
    bVar1 = std::
            queue<kj::Own<capnp::IncomingRpcMessage>,_std::deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>_>
            ::empty((queue<kj::Own<capnp::IncomingRpcMessage>,_std::deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>_>
                     *)(in_RSI + 0x1e8));
    if (bVar1) {
      local_190 = kj::_::readMaybe<kj::PromiseFulfiller<void>>
                            ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0x238));
      if (local_190 == (Own<kj::PromiseFulfiller<void>_> *)0x0) {
        kj::newPromiseAndFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>();
        __x = kj::mv<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>
                        ((Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>
                          *)&paf.promise.super_PromiseBase.node.ptr);
        std::
        queue<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>_>_>_>
        ::push((queue<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>_>_>_>
                *)(in_RSI + 0x198),__x);
        pPVar3 = kj::mv<kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>
                           ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)&result.ptr)
        ;
        kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::Promise
                  ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this,pPVar3);
        kj::PromiseFulfillerPair<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::
        ~PromiseFulfillerPair
                  ((PromiseFulfillerPair<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)
                   &result.ptr);
        pPVar5 = extraout_RDX_01;
      }
      else {
        pPVar2 = kj::Own<kj::PromiseFulfiller<void>_>::get(local_190);
        (**pPVar2->_vptr_PromiseFulfiller)(pPVar2,&local_191);
        this_00 = &paf.fulfiller.ptr;
        kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>::Maybe
                  ((Maybe<kj::Own<capnp::IncomingRpcMessage>_> *)this_00,(void *)0x0);
        kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::Promise
                  ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this,
                   (FixVoid<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this_00);
        kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>::~Maybe
                  ((Maybe<kj::Own<capnp::IncomingRpcMessage>_> *)&paf.fulfiller.ptr);
        pPVar5 = extraout_RDX_00;
      }
    }
    else {
      *(int *)(*(long *)(in_RSI + 0x20) + 0x14) = *(int *)(*(long *)(in_RSI + 0x20) + 0x14) + 1;
      t = std::
          queue<kj::Own<capnp::IncomingRpcMessage>,_std::deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>_>
          ::front((queue<kj::Own<capnp::IncomingRpcMessage>,_std::deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>_>
                   *)(in_RSI + 0x1e8));
      pOVar4 = kj::mv<kj::Own<capnp::IncomingRpcMessage>>(t);
      kj::Own<capnp::IncomingRpcMessage>::Own((Own<capnp::IncomingRpcMessage> *)local_1d8,pOVar4);
      std::
      queue<kj::Own<capnp::IncomingRpcMessage>,_std::deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>_>
      ::pop((queue<kj::Own<capnp::IncomingRpcMessage>,_std::deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>_>
             *)(in_RSI + 0x1e8));
      pOVar4 = kj::mv<kj::Own<capnp::IncomingRpcMessage>>
                         ((Own<capnp::IncomingRpcMessage> *)local_1d8);
      kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>::Maybe(&local_1e8,pOVar4);
      kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::Promise
                ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this,&local_1e8);
      kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>::~Maybe(&local_1e8);
      kj::Own<capnp::IncomingRpcMessage>::~Own((Own<capnp::IncomingRpcMessage> *)local_1d8);
      pPVar5 = extraout_RDX_02;
    }
  }
  else {
    kj::cp<kj::Exception>(&local_178,local_20);
    kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::Promise
              ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this,&local_178);
    kj::Exception::~Exception(&local_178);
    pPVar5 = extraout_RDX;
  }
  PVar6.super_PromiseBase.node.ptr = pPVar5;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>)PVar6.super_PromiseBase.node;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> receiveIncomingMessage() override {
      KJ_IF_MAYBE(e, networkException) {
        return kj::cp(*e);
      }

      if (messages.empty()) {
        KJ_IF_MAYBE(f, fulfillOnEnd) {
          f->get()->fulfill();
          return kj::Maybe<kj::Own<IncomingRpcMessage>>(nullptr);
        } else {
          auto paf = kj::newPromiseAndFulfiller<kj::Maybe<kj::Own<IncomingRpcMessage>>>();
          fulfillers.push(kj::mv(paf.fulfiller));
          return kj::mv(paf.promise);
        }
      }